

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

uint16_t * __thiscall
Apple::IIgs::Video::Video::output_double_high_resolution
          (Video *this,uint16_t *target,int start,int end,int row)

{
  uint16_t uVar1;
  int local_2c;
  uint8_t source [2];
  int c;
  uint16_t row_address;
  int row_local;
  int end_local;
  int start_local;
  uint16_t *target_local;
  Video *this_local;
  
  uVar1 = II::VideoSwitches<Cycles>::get_row_address(&this->super_VideoSwitches<Cycles>,row);
  _end_local = target;
  for (local_2c = start; local_2c < end; local_2c = local_2c + 1) {
    this->ntsc_shift_ =
         (uint)this->ram_[(int)((uint)uVar1 + local_2c)] << 0x19 |
         (uint)this->ram_[(int)(uVar1 + 0x10000 + local_2c)] << 0x12 | this->ntsc_shift_ >> 0xe;
    _end_local = output_shift(this,_end_local,local_2c << 1);
  }
  return _end_local;
}

Assistant:

uint16_t *Video::output_double_high_resolution(uint16_t *target, int start, int end, int row) {
	const uint16_t row_address = get_row_address(row);
	for(int c = start; c < end; c++) {
		const uint8_t source[2] = {
			ram_[0x10000 + row_address + c],
			ram_[row_address + c],
		};

		ntsc_shift_ = unsigned(source[1] << 25) | unsigned(source[0] << 18) | (ntsc_shift_ >> 14);
		target = output_shift(target, c*2);
	}

	return target;
}